

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

void rw::Matrix::makeRotation(Matrix *dst,V3d *axis,float32 angle)

{
  float32 __x;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  V3d VVar5;
  float local_28;
  float fStack_24;
  
  __x = dot(axis,axis);
  if (((float)__x != 0.0) || (NAN((float)__x))) {
    if ((float)__x < 0.0) {
      fVar2 = sqrtf((float)__x);
    }
    else {
      fVar2 = SQRT((float)__x);
    }
    __x = (float32)(1.0 / fVar2);
  }
  VVar5 = rw::scale(axis,__x);
  fVar3 = (float)VVar5.z;
  fVar2 = ((float)angle * 3.1415927) / 180.0;
  fVar1 = sinf(fVar2);
  fVar2 = cosf(fVar2);
  fVar4 = 1.0 - fVar2;
  local_28 = (float)VVar5.x;
  fStack_24 = (float)VVar5.y;
  (dst->right).x = (float32)(local_28 * local_28 * fVar4 + fVar2);
  (dst->right).y = (float32)(local_28 * fStack_24 * fVar4 + fVar3 * fVar1);
  (dst->up).x = (float32)(local_28 * fStack_24 * fVar4 + -(fVar3 * fVar1));
  (dst->up).y = (float32)(fStack_24 * fStack_24 * fVar4 + fVar2);
  (dst->right).z = (float32)(fVar3 * local_28 * fVar4 - fVar1 * fStack_24);
  (dst->up).z = (float32)(fVar3 * fStack_24 * fVar4 + fVar1 * local_28);
  (dst->at).x = (float32)(fVar3 * local_28 * fVar4 + fVar1 * fStack_24);
  (dst->at).y = (float32)(fVar3 * fStack_24 * fVar4 + -(fVar1 * local_28));
  (dst->at).z = (float32)(fVar3 * fVar3 * fVar4 + fVar2);
  (dst->pos).x = 0.0;
  (dst->pos).y = 0.0;
  *(undefined8 *)&(dst->pos).z = 0;
  dst->flags = 3;
  dst->pad2 = 0;
  dst->pad1 = 0;
  return;
}

Assistant:

void
Matrix::makeRotation(Matrix *dst, const V3d *axis, float32 angle)
{
//	V3d v = normalize(*axis);
	float32 len = dot(*axis, *axis);
	if(len != 0.0f) len = 1.0f/sqrtf(len);
	V3d v = rw::scale(*axis, len);
	angle = angle*(float)M_PI/180.0f;
	float32 s = sinf(angle);
	float32 c = cosf(angle);
	float32 t = 1.0f - c;

	dst->right.x = c + v.x*v.x*t;
	dst->right.y = v.x*v.y*t + v.z*s;
	dst->right.z = v.z*v.x*t - v.y*s;
	dst->up.x = v.x*v.y*t - v.z*s;
	dst->up.y = c + v.y*v.y*t;
	dst->up.z = v.y*v.z*t + v.x*s;
	dst->at.x = v.z*v.x*t + v.y*s;
	dst->at.y = v.y*v.z*t - v.x*s;
	dst->at.z = c + v.z*v.z*t;
	dst->pos.x = 0.0;
	dst->pos.y = 0.0;
	dst->pos.z = 0.0;
	dst->flags = TYPEORTHONORMAL;
	dst->pad1 = dst->pad2 = dst->pad3 = 0;
}